

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_outbound_item * nghttp2_session_pop_next_ob_item(nghttp2_session *session)

{
  int iVar1;
  nghttp2_outbound_item *item;
  nghttp2_session *session_local;
  
  session_local = (nghttp2_session *)(session->ob_urgent).head;
  if (session_local == (nghttp2_session *)0x0) {
    session_local = (nghttp2_session *)(session->ob_reg).head;
    if (session_local == (nghttp2_session *)0x0) {
      iVar1 = session_is_outgoing_concurrent_streams_max(session);
      if ((iVar1 == 0) &&
         (session_local = (nghttp2_session *)(session->ob_syn).head,
         session_local != (nghttp2_session *)0x0)) {
        nghttp2_outbound_queue_pop(&session->ob_syn);
        *(uint8_t *)&(session_local->root).sib_prev = '\0';
      }
      else if (session->remote_window_size < 1) {
        session_local = (nghttp2_session *)0x0;
      }
      else {
        session_local = (nghttp2_session *)nghttp2_stream_next_outbound_item(&session->root);
        if (session_local == (nghttp2_session *)0x0) {
          session_local = (nghttp2_session *)session_sched_get_next_outbound_item(session);
        }
      }
    }
    else {
      nghttp2_outbound_queue_pop(&session->ob_reg);
      *(uint8_t *)&(session_local->root).sib_prev = '\0';
    }
  }
  else {
    nghttp2_outbound_queue_pop(&session->ob_urgent);
    *(uint8_t *)&(session_local->root).sib_prev = '\0';
  }
  return (nghttp2_outbound_item *)session_local;
}

Assistant:

nghttp2_outbound_item *
nghttp2_session_pop_next_ob_item(nghttp2_session *session) {
  nghttp2_outbound_item *item;

  item = nghttp2_outbound_queue_top(&session->ob_urgent);
  if (item) {
    nghttp2_outbound_queue_pop(&session->ob_urgent);
    item->queued = 0;
    return item;
  }

  item = nghttp2_outbound_queue_top(&session->ob_reg);
  if (item) {
    nghttp2_outbound_queue_pop(&session->ob_reg);
    item->queued = 0;
    return item;
  }

  if (!session_is_outgoing_concurrent_streams_max(session)) {
    item = nghttp2_outbound_queue_top(&session->ob_syn);
    if (item) {
      nghttp2_outbound_queue_pop(&session->ob_syn);
      item->queued = 0;
      return item;
    }
  }

  if (session->remote_window_size > 0) {
    item = nghttp2_stream_next_outbound_item(&session->root);
    if (item) {
      return item;
    }

    return session_sched_get_next_outbound_item(session);
  }

  return NULL;
}